

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

void core::image::save_file(ConstPtr *image,string *filename)

{
  int iVar1;
  Exception *this;
  ulong uVar2;
  size_type *local_78;
  string fext4;
  ulong local_50;
  undefined1 local_48 [16];
  ConstPtr local_38;
  
  std::__cxx11::string::substr((ulong)((long)&fext4.field_2 + 8),(ulong)filename);
  local_78 = &fext4._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,fext4.field_2._8_8_,local_50 + fext4.field_2._8_8_);
  if (local_50 != 0) {
    uVar2 = 0;
    do {
      if ((byte)(*(byte *)((long)local_78 + uVar2) + 0xbf) < 0x1a) {
        *(byte *)((long)local_78 + uVar2) = *(byte *)((long)local_78 + uVar2) | 0x20;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_50);
  }
  if ((undefined1 *)fext4.field_2._8_8_ != local_48) {
    operator_delete((void *)fext4.field_2._8_8_);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar1 == 0) {
    local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (image->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    save_pfm_file(&local_38,filename);
    if (local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_78 != &fext4._M_string_length) {
      operator_delete(local_78);
    }
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  fext4.field_2._8_8_ = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&fext4.field_2 + 8),"Output filetype not supported","");
  util::Exception::Exception(this,(string *)((long)&fext4.field_2 + 8));
  __cxa_throw(this,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
save_file (FloatImage::ConstPtr image, std::string const& filename)
{

    using namespace util::string;
    std::string fext4 = lowercase(right(filename, 4));
    if (fext4 == ".pfm")
    {
        save_pfm_file(image, filename);
        return;
    }

    throw util::Exception("Output filetype not supported");
}